

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::io::anon_unknown_0::TokenizerTest_ParseInteger_Test::TestBody
          (TokenizerTest_ParseInteger_Test *this)

{
  AssertHelperData *pAVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  bool bVar4;
  size_t sVar5;
  pointer *__ptr;
  int *piVar6;
  string *psVar7;
  char *pcVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pdVar10;
  pointer pcVar11;
  char *in_R9;
  long lVar12;
  ostream *poVar13;
  AssertionResult gtest_ar;
  char decimal [32];
  char hex [32];
  uint64_t i_1;
  uint64_t parsed_4;
  uint64_t parsed;
  uint64_t parsed_2;
  uint64_t i;
  undefined1 local_f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  string local_d8;
  undefined1 local_b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_90;
  AssertHelper local_88;
  undefined1 local_80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  AssertHelper local_50;
  uint64_t local_48;
  AssertHelper local_40;
  long local_38;
  
  local_80 = (undefined1  [8])((ulong)local_80 & 0xffffffff00000000);
  paVar2 = &local_d8.field_2;
  psVar7 = (string *)0x1334487;
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"0","");
  local_b8 = (undefined1  [8])TokenizerTest::ParseInteger((TokenizerTest *)&local_d8,psVar7);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_f8,"0","ParseInteger(\"0\")",(int *)local_80,
             (unsigned_long *)local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar8 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x362,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_d8._M_dataplus._M_p + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_80._0_4_ = 0x7b;
  psVar7 = (string *)0x11c0cb4;
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"123","");
  local_b8 = (undefined1  [8])TokenizerTest::ParseInteger((TokenizerTest *)&local_d8,psVar7);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_f8,"123","ParseInteger(\"123\")",(int *)local_80,
             (unsigned_long *)local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar8 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x363,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_d8._M_dataplus._M_p + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_80._0_4_ = 0xabcdef12;
  pcVar8 = "0xabcdef12";
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"0xabcdef12","");
  local_b8 = (undefined1  [8])
             TokenizerTest::ParseInteger((TokenizerTest *)&local_d8,(string *)pcVar8);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_f8,"0xabcdef12u","ParseInteger(\"0xabcdef12\")",(uint *)local_80,
             (unsigned_long *)local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar8 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x364,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_d8._M_dataplus._M_p + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_80._0_4_ = 0xabcdef12;
  pcVar8 = "0xABCDEF12";
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"0xABCDEF12","");
  local_b8 = (undefined1  [8])
             TokenizerTest::ParseInteger((TokenizerTest *)&local_d8,(string *)pcVar8);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_f8,"0xabcdef12u","ParseInteger(\"0xABCDEF12\")",(uint *)local_80,
             (unsigned_long *)local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar8 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x365,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_d8._M_dataplus._M_p + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  pcVar8 = "0xFFFFFFFFFFFFFFFF";
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"0xFFFFFFFFFFFFFFFF","");
  local_b8 = (undefined1  [8])
             TokenizerTest::ParseInteger((TokenizerTest *)&local_d8,(string *)pcVar8);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_f8,"kuint64max","ParseInteger(\"0xFFFFFFFFFFFFFFFF\")",&kuint64max,
             (unsigned_long *)local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar8 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x366,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_d8._M_dataplus._M_p + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_80._0_4_ = 0x53977;
  pcVar8 = "01234567";
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"01234567","");
  local_b8 = (undefined1  [8])
             TokenizerTest::ParseInteger((TokenizerTest *)&local_d8,(string *)pcVar8);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_f8,"01234567","ParseInteger(\"01234567\")",(int *)local_80,
             (unsigned_long *)local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar8 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x367,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_d8._M_dataplus._M_p + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_80._0_4_ = 0x123;
  pcVar8 = "0X123";
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"0X123","");
  local_b8 = (undefined1  [8])
             TokenizerTest::ParseInteger((TokenizerTest *)&local_d8,(string *)pcVar8);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_f8,"0X123","ParseInteger(\"0X123\")",(int *)local_80,
             (unsigned_long *)local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar8 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x368,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_d8._M_dataplus._M_p + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_80 = (undefined1  [8])((ulong)local_80 & 0xffffffff00000000);
  psVar7 = (string *)0x1483942;
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"0x","");
  local_b8 = (undefined1  [8])TokenizerTest::ParseInteger((TokenizerTest *)&local_d8,psVar7);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_f8,"0","ParseInteger(\"0x\")",(int *)local_80,
             (unsigned_long *)local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar8 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x36b,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_d8._M_dataplus._M_p + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"zxy","");
  bVar4 = Tokenizer::ParseInteger(&local_d8,0xffffffffffffffff,&local_48);
  local_f8[0] = (internal)!bVar4;
  local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d8,(internal *)local_f8,
               (AssertionResult *)"Tokenizer::ParseInteger(\"zxy\", kuint64max, &i)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x370,local_d8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_b8 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"1.2","");
  bVar4 = Tokenizer::ParseInteger(&local_d8,0xffffffffffffffff,&local_48);
  local_f8[0] = (internal)!bVar4;
  local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d8,(internal *)local_f8,
               (AssertionResult *)"Tokenizer::ParseInteger(\"1.2\", kuint64max, &i)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x371,local_d8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_b8 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"08","");
  bVar4 = Tokenizer::ParseInteger(&local_d8,0xffffffffffffffff,&local_48);
  local_f8[0] = (internal)!bVar4;
  local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d8,(internal *)local_f8,
               (AssertionResult *)"Tokenizer::ParseInteger(\"08\", kuint64max, &i)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x372,local_d8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_b8 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"0xg","");
  bVar4 = Tokenizer::ParseInteger(&local_d8,0xffffffffffffffff,&local_48);
  local_f8[0] = (internal)!bVar4;
  local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d8,(internal *)local_f8,
               (AssertionResult *)"Tokenizer::ParseInteger(\"0xg\", kuint64max, &i)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x373,local_d8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_b8 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"-1","");
  bVar4 = Tokenizer::ParseInteger(&local_d8,0xffffffffffffffff,&local_48);
  local_f8[0] = (internal)!bVar4;
  local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d8,(internal *)local_f8,
               (AssertionResult *)"Tokenizer::ParseInteger(\"-1\", kuint64max, &i)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x374,local_d8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_b8 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"0","");
  bVar4 = Tokenizer::ParseInteger(&local_d8,0,&local_48);
  local_f8[0] = (internal)bVar4;
  local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d8,(internal *)local_f8,
               (AssertionResult *)"Tokenizer::ParseInteger(\"0\", 0, &i)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x377,local_d8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_b8 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"1","");
  bVar4 = Tokenizer::ParseInteger(&local_d8,0,&local_48);
  local_f8[0] = (internal)!bVar4;
  local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d8,(internal *)local_f8,
               (AssertionResult *)"Tokenizer::ParseInteger(\"1\", 0, &i)","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x378,local_d8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_b8 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"1","");
  bVar4 = Tokenizer::ParseInteger(&local_d8,1,&local_48);
  local_f8[0] = (internal)bVar4;
  local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d8,(internal *)local_f8,
               (AssertionResult *)"Tokenizer::ParseInteger(\"1\", 1, &i)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x379,local_d8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_b8 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"12345","");
  bVar4 = Tokenizer::ParseInteger(&local_d8,0x3039,&local_48);
  local_f8[0] = (internal)bVar4;
  local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d8,(internal *)local_f8,
               (AssertionResult *)"Tokenizer::ParseInteger(\"12345\", 12345, &i)","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x37a,local_d8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_b8 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"12346","");
  bVar4 = Tokenizer::ParseInteger(&local_d8,0x3039,&local_48);
  local_f8[0] = (internal)!bVar4;
  local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d8,(internal *)local_f8,
               (AssertionResult *)"Tokenizer::ParseInteger(\"12346\", 12345, &i)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x37b,local_d8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_b8 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"0xFFFFFFFFFFFFFFFF","");
  bVar4 = Tokenizer::ParseInteger(&local_d8,0xffffffffffffffff,&local_48);
  local_f8[0] = (internal)bVar4;
  local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d8,(internal *)local_f8,
               (AssertionResult *)"Tokenizer::ParseInteger(\"0xFFFFFFFFFFFFFFFF\", kuint64max, &i)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x37c,local_d8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_b8 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"0x10000000000000000","");
  bVar4 = Tokenizer::ParseInteger(&local_d8,0xffffffffffffffff,&local_48);
  local_f8[0] = (internal)!bVar4;
  local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d8,(internal *)local_f8,
               (AssertionResult *)"Tokenizer::ParseInteger(\"0x10000000000000000\", kuint64max, &i)"
               ,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x37d,local_d8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_b8 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  lVar12 = 0;
  do {
    lVar3 = lVar12 + -0x640;
    local_90._M_p = (pointer)(lVar12 + 0x7ffffffffffff9bf);
    snprintf((char *)&local_d8,0x20,"%llu");
    if (lVar3 < 1) {
      local_80 = (undefined1  [8])0xffffffffffffffff;
      local_f8 = (undefined1  [8])&local_e8;
      sVar5 = strlen((char *)&local_d8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f8,&local_d8,(long)&local_d8._M_dataplus._M_p + sVar5);
      bVar4 = Tokenizer::ParseInteger((string *)local_f8,0x7fffffffffffffff,(uint64_t *)local_80);
      local_b8[0] = (internal)bVar4;
      local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_f8 != (undefined1  [8])&local_e8) {
        operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
      }
      if (local_b8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_60);
        poVar13 = (ostream *)(local_60._M_head_impl + 0x10);
        sVar5 = strlen((char *)&local_d8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_d8,sVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_60._M_head_impl + 0x10),"=>",2);
        std::ostream::_M_insert<unsigned_long>((ulong)(local_60._M_head_impl + 0x10));
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_f8,(internal *)local_b8,
                   (AssertionResult *)"Tokenizer::ParseInteger(decimal, kint64max, &parsed)","false"
                   ,"true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x38c,(char *)local_f8);
        testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_60);
        testing::internal::AssertHelper::~AssertHelper(&local_88);
        if (local_f8 != (undefined1  [8])&local_e8) {
          operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
        }
        if (local_60._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_60._M_head_impl + 8))();
        }
      }
      if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_b0,local_b0);
      }
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)local_f8,"parsed","i",(unsigned_long *)local_80,
                 (unsigned_long *)&local_90);
      if (local_f8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_b8);
        pcVar11 = anon_var_dwarf_a12c75 + 5;
        if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar11 = (local_f0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x38e,pcVar11);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)local_b8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
        if (local_b8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_b8 + 8))();
        }
      }
      if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pdVar10 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f0;
        pbVar9 = local_f0;
        goto LAB_00b4d127;
      }
    }
    else {
      local_80 = (undefined1  [8])0xffffffffffffffff;
      local_f8 = (undefined1  [8])&local_e8;
      sVar5 = strlen((char *)&local_d8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f8,&local_d8,(long)&local_d8._M_dataplus._M_p + sVar5);
      bVar4 = Tokenizer::ParseInteger((string *)local_f8,0x7fffffffffffffff,(uint64_t *)local_80);
      local_b8[0] = (internal)!bVar4;
      local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_f8 != (undefined1  [8])&local_e8) {
        operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
      }
      if (local_b8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_60);
        poVar13 = (ostream *)(local_60._M_head_impl + 0x10);
        sVar5 = strlen((char *)&local_d8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_d8,sVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_60._M_head_impl + 0x10),"=>",2);
        std::ostream::_M_insert<unsigned_long>((ulong)(local_60._M_head_impl + 0x10));
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_f8,(internal *)local_b8,
                   (AssertionResult *)"Tokenizer::ParseInteger(decimal, kint64max, &parsed)","true",
                   "false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x388,(char *)local_f8);
        testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_60);
        testing::internal::AssertHelper::~AssertHelper(&local_88);
        if (local_f8 != (undefined1  [8])&local_e8) {
          operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
        }
        if (local_60._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_60._M_head_impl + 8))();
        }
      }
      if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pdVar10 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b0;
        pbVar9 = local_b0;
LAB_00b4d127:
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()(pdVar10,pbVar9);
      }
    }
    snprintf(local_f8,0x20,"0%llo",local_90._M_p);
    local_38 = lVar3;
    if (lVar3 < 1) {
      local_60._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           0xffffffffffffffff;
      local_b8 = (undefined1  [8])&local_a8;
      sVar5 = strlen(local_f8);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,local_f8,local_f8 + sVar5);
      bVar4 = Tokenizer::ParseInteger((string *)local_b8,0x7fffffffffffffff,(uint64_t *)&local_60);
      local_80[0] = bVar4;
      local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_b8 != (undefined1  [8])&local_a8) {
        operator_delete((void *)local_b8,local_a8._M_allocated_capacity + 1);
      }
      if (local_80[0] == '\0') {
        testing::Message::Message((Message *)&local_88);
        piVar6 = &(local_88.data_)->line;
        sVar5 = strlen(local_f8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)piVar6,local_f8,sVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_88.data_)->line,"=>",2);
        std::ostream::_M_insert<unsigned_long>((ulong)&(local_88.data_)->line);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_b8,(internal *)local_80,
                   (AssertionResult *)"Tokenizer::ParseInteger(octal, kint64max, &parsed)","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x398,(char *)local_b8);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_88);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (local_b8 != (undefined1  [8])&local_a8) {
          operator_delete((void *)local_b8,local_a8._M_allocated_capacity + 1);
        }
        if (local_88.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_88.data_ + 8))();
        }
      }
      if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_80 + 8),local_78);
      }
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)local_b8,"parsed","i",(unsigned_long *)&local_60,
                 (unsigned_long *)&local_90);
      if (local_b8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_80);
        pcVar11 = anon_var_dwarf_a12c75 + 5;
        if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar11 = (local_b0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x39a,pcVar11);
        testing::internal::AssertHelper::operator=(&local_88,(Message *)local_80);
        testing::internal::AssertHelper::~AssertHelper(&local_88);
        if (local_80 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_80 + 8))();
        }
      }
      if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pdVar10 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b0;
        pbVar9 = local_b0;
        goto LAB_00b4d513;
      }
    }
    else {
      local_60._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           0xffffffffffffffff;
      local_b8 = (undefined1  [8])&local_a8;
      sVar5 = strlen(local_f8);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,local_f8,local_f8 + sVar5);
      bVar4 = Tokenizer::ParseInteger((string *)local_b8,0x7fffffffffffffff,(uint64_t *)&local_60);
      local_80[0] = !bVar4;
      local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_b8 != (undefined1  [8])&local_a8) {
        operator_delete((void *)local_b8,local_a8._M_allocated_capacity + 1);
      }
      if (local_80[0] == '\0') {
        testing::Message::Message((Message *)&local_88);
        piVar6 = &(local_88.data_)->line;
        sVar5 = strlen(local_f8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)piVar6,local_f8,sVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_88.data_)->line,"=>",2);
        std::ostream::_M_insert<unsigned_long>((ulong)&(local_88.data_)->line);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_b8,(internal *)local_80,
                   (AssertionResult *)"Tokenizer::ParseInteger(octal, kint64max, &parsed)","true",
                   "false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x394,(char *)local_b8);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_88);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (local_b8 != (undefined1  [8])&local_a8) {
          operator_delete((void *)local_b8,local_a8._M_allocated_capacity + 1);
        }
        if (local_88.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_88.data_ + 8))();
        }
      }
      if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pdVar10 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)(local_80 + 8);
        pbVar9 = local_78;
LAB_00b4d513:
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()(pdVar10,pbVar9);
      }
    }
    snprintf(local_b8,0x20,"0x%llx",local_90._M_p);
    if (local_38 < 1) {
      local_88.data_ = (AssertHelperData *)0xffffffffffffffff;
      local_80 = (undefined1  [8])&local_70;
      sVar5 = strlen(local_b8);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_80,local_b8,local_b8 + sVar5);
      bVar4 = Tokenizer::ParseInteger((string *)local_80,0x7fffffffffffffff,(uint64_t *)&local_88);
      local_60._M_head_impl._0_1_ = (internal)bVar4;
      local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_80 != (undefined1  [8])&local_70) {
        operator_delete((void *)local_80,local_70._M_allocated_capacity + 1);
      }
      if (local_60._M_head_impl._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_50);
        piVar6 = &(local_50.data_)->line;
        sVar5 = strlen(local_b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)piVar6,local_b8,sVar5);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_80,(internal *)&local_60,
                   (AssertionResult *)"Tokenizer::ParseInteger(hex, kint64max, &parsed)","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_40,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x3a4,(char *)local_80);
        testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_50);
        testing::internal::AssertHelper::~AssertHelper(&local_40);
        if (local_80 != (undefined1  [8])&local_70) {
          operator_delete((void *)local_80,local_70._M_allocated_capacity + 1);
        }
        if (local_50.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_50.data_ + 8))();
        }
      }
      if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_58,local_58);
      }
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)local_80,"parsed","i",(unsigned_long *)&local_88,
                 (unsigned_long *)&local_90);
      if (local_80[0] == '\0') {
        testing::Message::Message((Message *)&local_60);
        pcVar11 = anon_var_dwarf_a12c75 + 5;
        if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar11 = (local_78->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x3a5,pcVar11);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_60);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (local_60._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_60._M_head_impl + 8))();
        }
      }
      if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pdVar10 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)(local_80 + 8);
        pbVar9 = local_78;
        goto LAB_00b4d91a;
      }
    }
    else {
      local_88.data_ = (AssertHelperData *)0xffffffffffffffff;
      local_80 = (undefined1  [8])&local_70;
      sVar5 = strlen(local_b8);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_80,local_b8,local_b8 + sVar5);
      bVar4 = Tokenizer::ParseInteger((string *)local_80,0x7fffffffffffffff,(uint64_t *)&local_88);
      local_60._M_head_impl._0_1_ = (internal)!bVar4;
      local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_80 != (undefined1  [8])&local_70) {
        operator_delete((void *)local_80,local_70._M_allocated_capacity + 1);
      }
      if (local_60._M_head_impl._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_50);
        piVar6 = &(local_50.data_)->line;
        sVar5 = strlen(local_b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)piVar6,local_b8,sVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_50.data_)->line,"=>",2);
        std::ostream::_M_insert<unsigned_long>((ulong)&(local_50.data_)->line);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_80,(internal *)&local_60,
                   (AssertionResult *)"Tokenizer::ParseInteger(hex, kint64max, &parsed)","true",
                   "false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_40,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x3a0,(char *)local_80);
        testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_50);
        testing::internal::AssertHelper::~AssertHelper(&local_40);
        if (local_80 != (undefined1  [8])&local_70) {
          operator_delete((void *)local_80,local_70._M_allocated_capacity + 1);
        }
        if (local_50.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_50.data_ + 8))();
        }
      }
      if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pdVar10 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58;
        pbVar9 = local_58;
LAB_00b4d91a:
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()(pdVar10,pbVar9);
      }
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0xc81);
  lVar12 = 0xf;
  do {
    lVar3 = lVar12 + -0x64f;
    pAVar1 = (AssertHelperData *)(lVar12 + -0x650);
    local_80 = (undefined1  [8])pAVar1;
    snprintf((char *)&local_d8,0x20,"1844674407370955%04llu",lVar12);
    if (lVar3 < 1) {
      local_60._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           0xffffffffffffffff;
      local_f8 = (undefined1  [8])&local_e8;
      sVar5 = strlen((char *)&local_d8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f8,&local_d8,(long)&local_d8._M_dataplus._M_p + sVar5);
      bVar4 = Tokenizer::ParseInteger((string *)local_f8,0xffffffffffffffff,(uint64_t *)&local_60);
      local_b8[0] = (internal)bVar4;
      local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_f8 != (undefined1  [8])&local_e8) {
        operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
      }
      if (local_b8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_90);
        poVar13 = (ostream *)(local_90._M_p + 0x10);
        sVar5 = strlen((char *)&local_d8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_d8,sVar5);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_f8,(internal *)local_b8,
                   (AssertionResult *)"Tokenizer::ParseInteger(decimal, kuint64max, &parsed)",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x3bb,(char *)local_f8);
        testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_88);
        if (local_f8 != (undefined1  [8])&local_e8) {
          operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
        }
        if ((long *)local_90._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_90._M_p + 8))();
        }
      }
      if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_b0,local_b0);
      }
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)local_f8,"parsed","i",(unsigned_long *)&local_60,
                 (unsigned_long *)local_80);
      if (local_f8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_b8);
        pcVar11 = anon_var_dwarf_a12c75 + 5;
        if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar11 = (local_f0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x3bd,pcVar11);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)local_b8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
        if (local_b8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_b8 + 8))();
        }
      }
      if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pdVar10 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f0;
        pbVar9 = local_f0;
        goto LAB_00b4dccf;
      }
    }
    else {
      local_60._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           0xffffffffffffffff;
      local_f8 = (undefined1  [8])&local_e8;
      sVar5 = strlen((char *)&local_d8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f8,&local_d8,(long)&local_d8._M_dataplus._M_p + sVar5);
      bVar4 = Tokenizer::ParseInteger((string *)local_f8,0xffffffffffffffff,(uint64_t *)&local_60);
      local_b8[0] = (internal)!bVar4;
      local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_f8 != (undefined1  [8])&local_e8) {
        operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
      }
      if (local_b8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_90);
        poVar13 = (ostream *)(local_90._M_p + 0x10);
        sVar5 = strlen((char *)&local_d8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_d8,sVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_90._M_p + 0x10),"=>",2)
        ;
        std::ostream::_M_insert<unsigned_long>((ulong)(local_90._M_p + 0x10));
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_f8,(internal *)local_b8,
                   (AssertionResult *)"Tokenizer::ParseInteger(decimal, kuint64max, &parsed)","true"
                   ,"false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x3b7,(char *)local_f8);
        testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_88);
        if (local_f8 != (undefined1  [8])&local_e8) {
          operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
        }
        if ((long *)local_90._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_90._M_p + 8))();
        }
      }
      if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pdVar10 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b0;
        pbVar9 = local_b0;
LAB_00b4dccf:
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()(pdVar10,pbVar9);
      }
    }
    if (lVar3 < 1) {
      local_80 = (undefined1  [8])pAVar1;
      snprintf((char *)&local_d8,0x20,"0%llo",pAVar1);
      local_60._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           0xffffffffffffffff;
      local_f8 = (undefined1  [8])&local_e8;
      sVar5 = strlen((char *)&local_d8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f8,&local_d8,(long)&local_d8._M_dataplus._M_p + sVar5);
      bVar4 = Tokenizer::ParseInteger((string *)local_f8,0xffffffffffffffff,(uint64_t *)&local_60);
      local_b8[0] = (internal)bVar4;
      local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_f8 != (undefined1  [8])&local_e8) {
        operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
      }
      if (local_b8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_90);
        poVar13 = (ostream *)(local_90._M_p + 0x10);
        sVar5 = strlen((char *)&local_d8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_d8,sVar5);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_f8,(internal *)local_b8,
                   (AssertionResult *)"Tokenizer::ParseInteger(octal, kuint64max, &parsed)","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x3cd,(char *)local_f8);
        testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_88);
        if (local_f8 != (undefined1  [8])&local_e8) {
          operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
        }
        if ((long *)local_90._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_90._M_p + 8))();
        }
      }
      if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_b0,local_b0);
      }
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)local_f8,"parsed","i",(unsigned_long *)&local_60,
                 (unsigned_long *)local_80);
      if (local_f8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_b8);
        pcVar11 = anon_var_dwarf_a12c75 + 5;
        if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar11 = (local_f0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x3cf,pcVar11);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)local_b8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
        if (local_b8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_b8 + 8))();
        }
      }
      if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pdVar10 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f0;
        pbVar9 = local_f0;
        goto LAB_00b4e067;
      }
    }
    else {
      local_80 = (undefined1  [8])pAVar1;
      snprintf((char *)&local_d8,0x20,"0200000000000000000%04llo",pAVar1);
      local_60._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           0xffffffffffffffff;
      local_f8 = (undefined1  [8])&local_e8;
      sVar5 = strlen((char *)&local_d8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f8,&local_d8,(long)&local_d8._M_dataplus._M_p + sVar5);
      bVar4 = Tokenizer::ParseInteger((string *)local_f8,0xffffffffffffffff,(uint64_t *)&local_60);
      local_b8[0] = (internal)!bVar4;
      local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_f8 != (undefined1  [8])&local_e8) {
        operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
      }
      if (local_b8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_90);
        poVar13 = (ostream *)(local_90._M_p + 0x10);
        sVar5 = strlen((char *)&local_d8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_d8,sVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_90._M_p + 0x10),"=>",2)
        ;
        std::ostream::_M_insert<unsigned_long>((ulong)(local_90._M_p + 0x10));
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_f8,(internal *)local_b8,
                   (AssertionResult *)"Tokenizer::ParseInteger(octal, kuint64max, &parsed)","true",
                   "false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x3c7,(char *)local_f8);
        testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_88);
        if (local_f8 != (undefined1  [8])&local_e8) {
          operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
        }
        if ((long *)local_90._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_90._M_p + 8))();
        }
      }
      if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pdVar10 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b0;
        pbVar9 = local_b0;
LAB_00b4e067:
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()(pdVar10,pbVar9);
      }
    }
    if (lVar12 == 0x64f || lVar3 < 0) {
      local_80 = (undefined1  [8])pAVar1;
      snprintf((char *)&local_d8,0x20,"0x%llx",pAVar1);
      local_60._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           0xffffffffffffffff;
      local_f8 = (undefined1  [8])&local_e8;
      sVar5 = strlen((char *)&local_d8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f8,&local_d8,(long)&local_d8._M_dataplus._M_p + sVar5);
      bVar4 = Tokenizer::ParseInteger((string *)local_f8,0xffffffffffffffff,(uint64_t *)&local_60);
      local_b8[0] = (internal)bVar4;
      local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_f8 != (undefined1  [8])&local_e8) {
        operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
      }
      if (local_b8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_90);
        poVar13 = (ostream *)(local_90._M_p + 0x10);
        sVar5 = strlen((char *)&local_d8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_d8,sVar5);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_f8,(internal *)local_b8,
                   (AssertionResult *)"Tokenizer::ParseInteger(hex, kuint64max, &parsed)","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x3de,(char *)local_f8);
        testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_88);
        if (local_f8 != (undefined1  [8])&local_e8) {
          operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
        }
        if ((long *)local_90._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_90._M_p + 8))();
        }
      }
      if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_b0,local_b0);
      }
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)local_f8,"parsed","ui",(unsigned_long *)&local_60,
                 (unsigned_long *)local_80);
      if (local_f8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_b8);
        pcVar11 = anon_var_dwarf_a12c75 + 5;
        if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar11 = (local_f0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x3df,pcVar11);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)local_b8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
        if (local_b8 != (undefined1  [8])0x0) {
          (**(code **)(*(size_type *)local_b8 + 8))();
        }
      }
      if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pdVar10 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f0;
        pbVar9 = local_f0;
        goto LAB_00b4e400;
      }
    }
    else {
      local_80 = (undefined1  [8])pAVar1;
      snprintf((char *)&local_d8,0x20,"0x1000000000000%04llx",pAVar1);
      local_60._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           0xffffffffffffffff;
      local_f8 = (undefined1  [8])&local_e8;
      sVar5 = strlen((char *)&local_d8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f8,&local_d8,(long)&local_d8._M_dataplus._M_p + sVar5);
      bVar4 = Tokenizer::ParseInteger((string *)local_f8,0xffffffffffffffff,(uint64_t *)&local_60);
      local_b8[0] = (internal)!bVar4;
      local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_f8 != (undefined1  [8])&local_e8) {
        operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
      }
      if (local_b8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_90);
        poVar13 = (ostream *)(local_90._M_p + 0x10);
        sVar5 = strlen((char *)&local_d8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_d8,sVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_90._M_p + 0x10),"=>",2)
        ;
        std::ostream::_M_insert<unsigned_long>((ulong)(local_90._M_p + 0x10));
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_f8,(internal *)local_b8,
                   (AssertionResult *)"Tokenizer::ParseInteger(hex, kuint64max, &parsed)","true",
                   "false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x3d9,(char *)local_f8);
        testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_88);
        if (local_f8 != (undefined1  [8])&local_e8) {
          operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
        }
        if ((long *)local_90._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_90._M_p + 8))();
        }
      }
      if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pdVar10 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b0;
        pbVar9 = local_b0;
LAB_00b4e400:
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()(pdVar10,pbVar9);
      }
    }
    lVar12 = lVar12 + 1;
    if (lVar12 == 0xc90) {
      return;
    }
  } while( true );
}

Assistant:

TEST_F(TokenizerTest, ParseInteger) {
  EXPECT_EQ(0, ParseInteger("0"));
  EXPECT_EQ(123, ParseInteger("123"));
  EXPECT_EQ(0xabcdef12u, ParseInteger("0xabcdef12"));
  EXPECT_EQ(0xabcdef12u, ParseInteger("0xABCDEF12"));
  EXPECT_EQ(kuint64max, ParseInteger("0xFFFFFFFFFFFFFFFF"));
  EXPECT_EQ(01234567, ParseInteger("01234567"));
  EXPECT_EQ(0X123, ParseInteger("0X123"));

  // Test invalid integers that may still be tokenized as integers.
  EXPECT_EQ(0, ParseInteger("0x"));

  uint64_t i;

  // Test invalid integers that will never be tokenized as integers.
  EXPECT_FALSE(Tokenizer::ParseInteger("zxy", kuint64max, &i));
  EXPECT_FALSE(Tokenizer::ParseInteger("1.2", kuint64max, &i));
  EXPECT_FALSE(Tokenizer::ParseInteger("08", kuint64max, &i));
  EXPECT_FALSE(Tokenizer::ParseInteger("0xg", kuint64max, &i));
  EXPECT_FALSE(Tokenizer::ParseInteger("-1", kuint64max, &i));

  // Test overflows.
  EXPECT_TRUE(Tokenizer::ParseInteger("0", 0, &i));
  EXPECT_FALSE(Tokenizer::ParseInteger("1", 0, &i));
  EXPECT_TRUE(Tokenizer::ParseInteger("1", 1, &i));
  EXPECT_TRUE(Tokenizer::ParseInteger("12345", 12345, &i));
  EXPECT_FALSE(Tokenizer::ParseInteger("12346", 12345, &i));
  EXPECT_TRUE(Tokenizer::ParseInteger("0xFFFFFFFFFFFFFFFF", kuint64max, &i));
  EXPECT_FALSE(Tokenizer::ParseInteger("0x10000000000000000", kuint64max, &i));

  // Test near the limits of signed parsing (values in kint64max +/- 1600)
  for (int64_t offset = -1600; offset <= 1600; ++offset) {
    // We make sure to perform an unsigned addition so that we avoid signed
    // overflow, which would be undefined behavior.
    uint64_t i = 0x7FFFFFFFFFFFFFFFu + static_cast<uint64_t>(offset);
    char decimal[32];
    snprintf(decimal, 32, "%llu", static_cast<unsigned long long>(i));
    if (offset > 0) {
      uint64_t parsed = -1;
      EXPECT_FALSE(Tokenizer::ParseInteger(decimal, kint64max, &parsed))
          << decimal << "=>" << parsed;
    } else {
      uint64_t parsed = -1;
      EXPECT_TRUE(Tokenizer::ParseInteger(decimal, kint64max, &parsed))
          << decimal << "=>" << parsed;
      EXPECT_EQ(parsed, i);
    }
    char octal[32];
    snprintf(octal, 32, "0%llo", static_cast<unsigned long long>(i));
    if (offset > 0) {
      uint64_t parsed = -1;
      EXPECT_FALSE(Tokenizer::ParseInteger(octal, kint64max, &parsed))
          << octal << "=>" << parsed;
    } else {
      uint64_t parsed = -1;
      EXPECT_TRUE(Tokenizer::ParseInteger(octal, kint64max, &parsed))
          << octal << "=>" << parsed;
      EXPECT_EQ(parsed, i);
    }
    char hex[32];
    snprintf(hex, 32, "0x%llx", static_cast<unsigned long long>(i));
    if (offset > 0) {
      uint64_t parsed = -1;
      EXPECT_FALSE(Tokenizer::ParseInteger(hex, kint64max, &parsed))
          << hex << "=>" << parsed;
    } else {
      uint64_t parsed = -1;
      EXPECT_TRUE(Tokenizer::ParseInteger(hex, kint64max, &parsed)) << hex;
      EXPECT_EQ(parsed, i);
    }
    // EXPECT_NE(offset, -237);
  }

  // Test near the limits of unsigned parsing (values in kuint64max +/- 1600)
  // By definition, values greater than kuint64max cannot be held in a uint64_t
  // variable, so printing them is a little tricky; fortunately all but the
  // last four digits are known, so we can hard-code them in the printf string,
  // and we only need to format the last 4.
  for (int64_t offset = -1600; offset <= 1600; ++offset) {
    {
      uint64_t i = 18446744073709551615u + offset;
      char decimal[32];
      snprintf(decimal, 32, "1844674407370955%04llu",
               static_cast<unsigned long long>(1615 + offset));
      if (offset > 0) {
        uint64_t parsed = -1;
        EXPECT_FALSE(Tokenizer::ParseInteger(decimal, kuint64max, &parsed))
            << decimal << "=>" << parsed;
      } else {
        uint64_t parsed = -1;
        EXPECT_TRUE(Tokenizer::ParseInteger(decimal, kuint64max, &parsed))
            << decimal;
        EXPECT_EQ(parsed, i);
      }
    }
    {
      uint64_t i = 01777777777777777777777u + offset;
      if (offset > 0) {
        char octal[32];
        snprintf(octal, 32, "0200000000000000000%04llo",
                 static_cast<unsigned long long>(offset - 1));
        uint64_t parsed = -1;
        EXPECT_FALSE(Tokenizer::ParseInteger(octal, kuint64max, &parsed))
            << octal << "=>" << parsed;
      } else {
        char octal[32];
        snprintf(octal, 32, "0%llo", static_cast<unsigned long long>(i));
        uint64_t parsed = -1;
        EXPECT_TRUE(Tokenizer::ParseInteger(octal, kuint64max, &parsed))
            << octal;
        EXPECT_EQ(parsed, i);
      }
    }
    {
      uint64_t ui = 0xffffffffffffffffu + offset;
      char hex[32];
      if (offset > 0) {
        snprintf(hex, 32, "0x1000000000000%04llx",
                 static_cast<unsigned long long>(offset - 1));
        uint64_t parsed = -1;
        EXPECT_FALSE(Tokenizer::ParseInteger(hex, kuint64max, &parsed))
            << hex << "=>" << parsed;
      } else {
        snprintf(hex, 32, "0x%llx", static_cast<unsigned long long>(ui));
        uint64_t parsed = -1;
        EXPECT_TRUE(Tokenizer::ParseInteger(hex, kuint64max, &parsed)) << hex;
        EXPECT_EQ(parsed, ui);
      }
    }
  }
}